

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.c
# Opt level: O2

ASTNode * ParseIdent(Scope *scope,Lexer *lexer)

{
  ASTNode *pAVar1;
  PeekedToken peeked;
  PeekedToken local_28;
  
  PeekNextToken(lexer,&local_28);
  if (local_28.token == LPAREN) {
    pAVar1 = ParseFuncCall(scope,lexer);
  }
  else {
    BackOneToken(lexer);
    pAVar1 = ParseExpression(scope,lexer);
  }
  return pAVar1;
}

Assistant:

ASTNode* ParseIdent(Scope* scope, Lexer* lexer){
	DEBUG_PRINT_SYNTAX("Ident");
	TRACK();
	PeekedToken peeked;
	PeekNextToken(lexer, &peeked);
	if (peeked.token == LPAREN){
		return ParseFuncCall(scope, lexer);
	}
	BackOneToken(lexer);
	return ParseExpression(scope, lexer);
}